

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O1

int ImfHeaderV2iAttribute(ImfHeader *hdr,char *name,int *x,int *y)

{
  TypedAttribute<Imath_3_2::Vec2<int>_> *pTVar1;
  
  pTVar1 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>>>
                     ((Header *)hdr,name);
  *x = (pTVar1->_value).x;
  *y = (pTVar1->_value).y;
  return 1;
}

Assistant:

int
ImfHeaderV2iAttribute (const ImfHeader* hdr, const char name[], int* x, int* y)
{
    try
    {
        const V2i& v =
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::V2iAttribute> (
                    name)
                .value ();

        *x = v.x;
        *y = v.y;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}